

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O0

void duckdb_je_sec_mutex_stats_read(tsdn_t *tsdn,sec_t *sec,mutex_prof_data_t *mutex_prof_data)

{
  malloc_mutex_t *in_RDX;
  tsdn_t *in_RSI;
  tsdn_t *in_RDI;
  mutex_prof_data_t *unaff_retaddr;
  size_t i;
  ulong local_20;
  
  for (local_20 = 0; local_20 < *(ulong *)((long)&in_RSI->tsd + 0x40); local_20 = local_20 + 1) {
    malloc_mutex_lock(in_RDI,(malloc_mutex_t *)in_RSI);
    malloc_mutex_prof_accum((tsdn_t *)i,unaff_retaddr,(malloc_mutex_t *)in_RDI);
    malloc_mutex_unlock(in_RSI,in_RDX);
  }
  return;
}

Assistant:

void
sec_mutex_stats_read(tsdn_t *tsdn, sec_t *sec,
    mutex_prof_data_t *mutex_prof_data) {
	for (size_t i = 0; i < sec->opts.nshards; i++) {
		malloc_mutex_lock(tsdn, &sec->shards[i].mtx);
		malloc_mutex_prof_accum(tsdn, mutex_prof_data,
		    &sec->shards[i].mtx);
		malloc_mutex_unlock(tsdn, &sec->shards[i].mtx);
	}
}